

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

bool __thiscall FIX::SessionState::set(SessionState *this,SEQNUM s,string *m)

{
  int iVar1;
  Locker local_28;
  Locker l;
  string *m_local;
  SEQNUM s_local;
  SessionState *this_local;
  
  l.m_mutex = (Mutex *)m;
  Locker::Locker(&local_28,&this->m_mutex);
  iVar1 = (*this->m_pStore->_vptr_MessageStore[2])(this->m_pStore,s,l.m_mutex);
  Locker::~Locker(&local_28);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

EXCEPT(IOException) {
    Locker l(m_mutex);
    return m_pStore->set(s, m);
  }